

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall asmjit::_abi_1_10::BaseEmitter::setLogger(BaseEmitter *this,Logger *logger)

{
  Logger *pLVar1;
  BaseEmitter *in_RSI;
  long in_RDI;
  BaseEmitter *unaff_retaddr;
  EmitterFlags flags;
  
  flags = (EmitterFlags)((ulong)in_RDI >> 0x38);
  if (in_RSI == (BaseEmitter *)0x0) {
    *(undefined8 *)(in_RDI + 0x38) = 0;
    _clearEmitterFlags(unaff_retaddr,flags);
    if (*(long *)(in_RDI + 0x30) != 0) {
      pLVar1 = CodeHolder::logger(*(CodeHolder **)(in_RDI + 0x30));
      *(Logger **)(in_RDI + 0x38) = pLVar1;
    }
  }
  else {
    *(BaseEmitter **)(in_RDI + 0x38) = in_RSI;
    _addEmitterFlags(in_RSI,flags);
  }
  BaseEmitter_updateForcedOptions(in_RSI);
  return;
}

Assistant:

void BaseEmitter::setLogger(Logger* logger) noexcept {
#ifndef ASMJIT_NO_LOGGING
  if (logger) {
    _logger = logger;
    _addEmitterFlags(EmitterFlags::kOwnLogger);
  }
  else {
    _logger = nullptr;
    _clearEmitterFlags(EmitterFlags::kOwnLogger);
    if (_code)
      _logger = _code->logger();
  }
  BaseEmitter_updateForcedOptions(this);
#else
  DebugUtils::unused(logger);
#endif
}